

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O0

void radio_click(t_radio *x,t_floatarg xpos,t_floatarg ypos,t_floatarg shift,t_floatarg ctrl,
                t_floatarg alt)

{
  int iVar1;
  int yy;
  int xx;
  t_floatarg alt_local;
  t_floatarg ctrl_local;
  t_floatarg shift_local;
  t_floatarg ypos_local;
  t_floatarg xpos_local;
  t_radio *x_local;
  
  if (x->x_orientation == horizontal) {
    iVar1 = text_xpix((t_text *)x,(x->x_gui).x_glist);
    radio_fout(x,(float)(((int)xpos - iVar1) / (x->x_gui).x_w));
  }
  else {
    iVar1 = text_ypix((t_text *)x,(x->x_gui).x_glist);
    radio_fout(x,(float)(((int)ypos - iVar1) / (x->x_gui).x_h));
  }
  return;
}

Assistant:

static void radio_click(t_radio *x, t_floatarg xpos, t_floatarg ypos, t_floatarg shift, t_floatarg ctrl, t_floatarg alt)
{
    if (x->x_orientation == horizontal)
    {
        int xx = (int)xpos - (int)text_xpix(&x->x_gui.x_obj, x->x_gui.x_glist);
        radio_fout(x, (t_float)(xx / x->x_gui.x_w));
    } else {
        int yy =  (int)ypos - text_ypix(&x->x_gui.x_obj, x->x_gui.x_glist);
        radio_fout(x, (t_float)(yy / x->x_gui.x_h));
    }
}